

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkDistance.cpp
# Opt level: O3

void __thiscall chrono::ChLinkDistance::ChLinkDistance(ChLinkDistance *this,ChLinkDistance *other)

{
  ChBodyFrame *pCVar1;
  ChBodyFrame *pCVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  ChLink::ChLink(&this->super_ChLink,&other->super_ChLink);
  (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLinkDistance_00b160a8;
  (this->pos1).m_data[0] = 0.0;
  (this->pos1).m_data[1] = 0.0;
  (this->pos1).m_data[2] = 0.0;
  (this->pos2).m_data[0] = 0.0;
  (this->pos1).m_data[2] = 0.0;
  (this->pos2).m_data[0] = 0.0;
  (this->pos2).m_data[1] = 0.0;
  (this->pos2).m_data[2] = 0.0;
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->Cx);
  pCVar2 = (other->super_ChLink).Body2;
  pCVar1 = (other->super_ChLink).Body1;
  (this->super_ChLink).Body1 = (other->super_ChLink).Body1;
  (this->super_ChLink).Body2 = pCVar2;
  (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.system =
       (other->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.system;
  iVar4 = (*(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  iVar5 = (*(((other->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->Cx,(ChVariables *)CONCAT44(extraout_var,iVar4),
             (ChVariables *)CONCAT44(extraout_var_00,iVar5));
  if (other != this) {
    (this->pos1).m_data[0] = (other->pos1).m_data[0];
    (this->pos1).m_data[1] = (other->pos1).m_data[1];
    (this->pos1).m_data[2] = (other->pos1).m_data[2];
    (this->pos2).m_data[0] = (other->pos2).m_data[0];
    (this->pos2).m_data[1] = (other->pos2).m_data[1];
    (this->pos2).m_data[2] = (other->pos2).m_data[2];
  }
  dVar3 = other->curr_dist;
  this->distance = other->distance;
  this->curr_dist = dVar3;
  return;
}

Assistant:

ChLinkDistance::ChLinkDistance(const ChLinkDistance& other) : ChLink(other) {
    Body1 = other.Body1;
    Body2 = other.Body2;
    system = other.system;
    Cx.SetVariables(&other.Body1->Variables(), &other.Body2->Variables());
    pos1 = other.pos1;
    pos2 = other.pos2;
    distance = other.distance;
    curr_dist = other.curr_dist;
}